

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks.h
# Opt level: O0

void __thiscall spdlog::sinks::stderr_sink<std::mutex>::~stderr_sink(stderr_sink<std::mutex> *this)

{
  stderr_sink<std::mutex> *this_local;
  
  ~stderr_sink(this);
  operator_delete(this);
  return;
}

Assistant:

class stderr_sink SPDLOG_FINAL : public base_sink<Mutex>
{
    using MyType = stderr_sink<Mutex>;

public:
    explicit stderr_sink() = default;

    static std::shared_ptr<MyType> instance()
    {
        static std::shared_ptr<MyType> instance = std::make_shared<MyType>();
        return instance;
    }

protected:
    void _sink_it(const details::log_msg &msg) override
    {
        fwrite(msg.formatted.data(), sizeof(char), msg.formatted.size(), stderr);
        _flush();
    }